

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Table * sqlite3LocateTable(Parse *pParse,u32 flags,char *zName,char *zDbase)

{
  int iVar1;
  Module *zName_00;
  sqlite3 *in_RCX;
  char *in_RDX;
  uint in_ESI;
  Parse *in_RDI;
  char *zMsg;
  Module *pMod;
  sqlite3 *db;
  Table *p;
  char *in_stack_ffffffffffffffb8;
  Parse *in_stack_ffffffffffffffc0;
  sqlite3 *db_00;
  char *pcVar2;
  Table *local_8;
  
  pcVar2 = &DAT_aaaaaaaaaaaaaaaa;
  db_00 = in_RDI->db;
  if (((db_00->mDbFlags & 0x10) == 0) &&
     (iVar1 = sqlite3ReadSchema(in_stack_ffffffffffffffc0), iVar1 != 0)) {
    local_8 = (Table *)0x0;
  }
  else {
    local_8 = sqlite3FindTable(in_RCX,pcVar2,(char *)db_00);
    if (local_8 == (Table *)0x0) {
      if (((in_RDI->prepFlags & 4) == 0) && ((db_00->init).busy == '\0')) {
        zName_00 = (Module *)
                   sqlite3HashFind((Hash *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        if ((zName_00 == (Module *)0x0) &&
           (iVar1 = sqlite3_strnicmp(in_RDX,"pragma_",7), iVar1 == 0)) {
          zName_00 = sqlite3PragmaVtabRegister(db_00,(char *)zName_00);
        }
        if ((zName_00 != (Module *)0x0) &&
           (iVar1 = sqlite3VtabEponymousTableInit((Parse *)pMod,(Module *)zMsg), iVar1 != 0)) {
          return zName_00->pEpoTab;
        }
      }
      if ((in_ESI & 2) != 0) {
        return (Table *)0x0;
      }
      in_RDI->checkSchema = '\x01';
    }
    else if ((local_8->eTabType == '\x01') && ((in_RDI->prepFlags & 4) != 0)) {
      local_8 = (Table *)0x0;
    }
    if (local_8 == (Table *)0x0) {
      pcVar2 = "no such table";
      if ((in_ESI & 1) != 0) {
        pcVar2 = "no such view";
      }
      if (in_RCX == (sqlite3 *)0x0) {
        sqlite3ErrorMsg(in_RDI,"%s: %s",pcVar2,in_RDX);
      }
      else {
        sqlite3ErrorMsg(in_RDI,"%s: %s.%s",pcVar2,in_RCX,in_RDX);
      }
    }
  }
  return local_8;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3LocateTable(
  Parse *pParse,         /* context in which to report errors */
  u32 flags,             /* LOCATE_VIEW or LOCATE_NOERR */
  const char *zName,     /* Name of the table we are looking for */
  const char *zDbase     /* Name of the database.  Might be NULL */
){
  Table *p;
  sqlite3 *db = pParse->db;

  /* Read the database schema. If an error occurs, leave an error message
  ** and code in pParse and return NULL. */
  if( (db->mDbFlags & DBFLAG_SchemaKnownOk)==0
   && SQLITE_OK!=sqlite3ReadSchema(pParse)
  ){
    return 0;
  }

  p = sqlite3FindTable(db, zName, zDbase);
  if( p==0 ){
#ifndef SQLITE_OMIT_VIRTUALTABLE
    /* If zName is the not the name of a table in the schema created using
    ** CREATE, then check to see if it is the name of an virtual table that
    ** can be an eponymous virtual table. */
    if( (pParse->prepFlags & SQLITE_PREPARE_NO_VTAB)==0 && db->init.busy==0 ){
      Module *pMod = (Module*)sqlite3HashFind(&db->aModule, zName);
      if( pMod==0 && sqlite3_strnicmp(zName, "pragma_", 7)==0 ){
        pMod = sqlite3PragmaVtabRegister(db, zName);
      }
      if( pMod && sqlite3VtabEponymousTableInit(pParse, pMod) ){
        testcase( pMod->pEpoTab==0 );
        return pMod->pEpoTab;
      }
    }
#endif
    if( flags & LOCATE_NOERR ) return 0;
    pParse->checkSchema = 1;
  }else if( IsVirtual(p) && (pParse->prepFlags & SQLITE_PREPARE_NO_VTAB)!=0 ){
    p = 0;
  }

  if( p==0 ){
    const char *zMsg = flags & LOCATE_VIEW ? "no such view" : "no such table";
    if( zDbase ){
      sqlite3ErrorMsg(pParse, "%s: %s.%s", zMsg, zDbase, zName);
    }else{
      sqlite3ErrorMsg(pParse, "%s: %s", zMsg, zName);
    }
  }else{
    assert( HasRowid(p) || p->iPKey<0 );
  }

  return p;
}